

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall
wabt::WastParser::ParseAssertScriptModuleCommand<wabt::AssertModuleCommand<(wabt::CommandType)4>>
          (WastParser *this,TokenType token_type,CommandPtr *out_command)

{
  Command *pCVar1;
  Command *pCVar2;
  Result RVar3;
  Enum EVar4;
  Command *local_30;
  
  pCVar2 = local_30;
  RVar3 = Expect(this,Lpar);
  EVar4 = Error;
  if ((RVar3.enum_ != Error) && (RVar3 = Expect(this,token_type), RVar3.enum_ != Error)) {
    MakeUnique<wabt::AssertModuleCommand<(wabt::CommandType)4>>();
    RVar3 = ParseScriptModule(this,(unique_ptr<wabt::ScriptModule,_std::default_delete<wabt::ScriptModule>_>
                                    *)(local_30 + 1));
    EVar4 = Error;
    if ((RVar3.enum_ != Error) &&
       ((RVar3 = ParseQuotedText(this,(string *)&local_30[1].type), RVar3.enum_ != Error &&
        (RVar3 = Expect(this,Rpar), RVar3.enum_ != Error)))) {
      local_30 = (Command *)0x0;
      pCVar1 = (out_command->_M_t).
               super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>._M_t.
               super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
               super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl;
      (out_command->_M_t).super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>.
      _M_t.super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
      super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl = pCVar2;
      if (pCVar1 == (Command *)0x0) {
        return (Result)Ok;
      }
      (*pCVar1->_vptr_Command[1])();
      EVar4 = Ok;
    }
    if (local_30 != (Command *)0x0) {
      (*local_30->_vptr_Command[1])();
    }
  }
  return (Result)EVar4;
}

Assistant:

Result WastParser::ParseAssertScriptModuleCommand(TokenType token_type,
                                                  CommandPtr* out_command) {
  WABT_TRACE(ParseAssertScriptModuleCommand);
  EXPECT(Lpar);
  CHECK_RESULT(Expect(token_type));
  auto command = MakeUnique<T>();
  CHECK_RESULT(ParseScriptModule(&command->module));
  CHECK_RESULT(ParseQuotedText(&command->text));
  EXPECT(Rpar);
  *out_command = std::move(command);
  return Result::Ok;
}